

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::ConvertToSampledImagePass::CreateImageExtraction
          (ConvertToSampledImagePass *this,Instruction *sampled_image)

{
  Analysis preserved_analyses;
  uint32_t type_id;
  uint32_t operand1;
  IRContext *pIVar1;
  Instruction *pIVar2;
  TypeManager *type_mgr;
  undefined1 local_38 [8];
  InstructionBuilder builder;
  Instruction *sampled_image_local;
  ConvertToSampledImagePass *this_local;
  
  builder._24_8_ = sampled_image;
  pIVar1 = Pass::context(&this->super_Pass);
  pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)builder._24_8_);
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_38,pIVar1,pIVar2,preserved_analyses);
  pIVar1 = Pass::context(&this->super_Pass);
  type_mgr = IRContext::get_type_mgr(pIVar1);
  type_id = anon_unknown_19::GetImageTypeOfSampledImage(type_mgr,(Instruction *)builder._24_8_);
  operand1 = opt::Instruction::result_id((Instruction *)builder._24_8_);
  pIVar2 = InstructionBuilder::AddUnaryOp((InstructionBuilder *)local_38,type_id,OpImage,operand1);
  return pIVar2;
}

Assistant:

Instruction* ConvertToSampledImagePass::CreateImageExtraction(
    Instruction* sampled_image) {
  InstructionBuilder builder(
      context(), sampled_image->NextNode(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  return builder.AddUnaryOp(
      GetImageTypeOfSampledImage(context()->get_type_mgr(), sampled_image),
      spv::Op::OpImage, sampled_image->result_id());
}